

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

void __thiscall
hnsw::HNSWIndex::HNSWIndex
          (HNSWIndex *this,float *data,uint32_t n_points,uint32_t dim,Distance *distance,int M,
          int ef_construction)

{
  int *piVar1;
  undefined4 in_ECX;
  Index *in_RDI;
  Matrix *in_R8;
  int in_R9D;
  double dVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *this_00;
  size_t in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffd8;
  
  Index::Index(in_RDI);
  in_RDI->_vptr_Index = (_func_int **)&PTR_Build_00126cf0;
  *(undefined4 *)((long)&in_RDI[5]._vptr_Index + 4) = 0;
  std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::vector
            ((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *)0x1130e7);
  this_00 = (vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *)
            (in_RDI + 9);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_ffffffffffffffa0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x11310a);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)0x11311a);
  Matrix::Matrix(in_R8,(float *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  *(undefined4 *)&in_RDI[0x16]._vptr_Index = 0;
  in_RDI[0x17]._vptr_Index = (_func_int **)in_R8;
  *(undefined4 *)((long)&in_RDI[5]._vptr_Index + 4) = 0;
  *(int *)&in_RDI[1]._vptr_Index = in_R9D;
  *(int *)((long)&in_RDI[1]._vptr_Index + 4) = in_R9D;
  *(int *)&in_RDI[2]._vptr_Index = in_R9D * 2;
  dVar2 = log((double)in_R9D);
  in_RDI[3]._vptr_Index = (_func_int **)(1.0 / dVar2);
  *(undefined4 *)&in_RDI[4]._vptr_Index = 0;
  piVar1 = std::max<int>((int *)&stack0x00000008,(int *)&stack0xffffffffffffffdc);
  *(int *)((long)&in_RDI[4]._vptr_Index + 4) = *piVar1;
  *(undefined4 *)((long)&in_RDI[0x16]._vptr_Index + 4) = in_ECX;
  std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::resize
            (this_00,(size_type)in_RDI);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)in_R8,
             CONCAT44(in_R9D,in_stack_ffffffffffffffd8),(bool)in_stack_ffffffffffffffd7);
  return;
}

Assistant:

HNSWIndex(float *data,
            uint32_t n_points,
            uint32_t dim,
            const Distance &distance,
            int M,
            int ef_construction)
      : points_(data, n_points, dim), distance_(distance) {
    top_layer_ = 0;
    M_ = M;
    maxM_ = M;
    maxM0_ = 2 * M;
    ml_ = 1 / log(1.0 * M);
    ef_search_ = 0;
    ef_construction_ = std::max(ef_construction, M);
    dim_ = dim;

    vertices_.resize(n_points);
    visited_.resize(n_points);
  }